

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O1

void __thiscall testing::internal::CapturedStream::CapturedStream(CapturedStream *this,int fd)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  char name_template [28];
  GTestLog local_5c;
  char local_58 [40];
  
  this->fd_ = fd;
  iVar2 = dup(fd);
  this->uncaptured_fd_ = iVar2;
  (this->filename_)._M_dataplus._M_p = (pointer)&(this->filename_).field_2;
  (this->filename_)._M_string_length = 0;
  (this->filename_).field_2._M_local_buf[0] = '\0';
  builtin_strncpy(local_58 + 0x10,"ream.XXXXXX",0xc);
  builtin_strncpy(local_58,"/tmp/captured_st",0x10);
  iVar2 = mkstemp(local_58);
  if (iVar2 == -1) {
    GTestLog::GTestLog(&local_5c,GTEST_WARNING,
                       "/workspace/llm4binary/github/license_c_cmakelists/loganzartman[P]gl-pic-fluid/googletest/googletest/src/gtest-port.cc"
                       ,0x45e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Failed to create tmp file ",0x1a);
    sVar3 = strlen(local_58);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_58,sVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," for test; does the test have access to the /tmp directory?",
               0x3b);
    GTestLog::~GTestLog(&local_5c);
  }
  pcVar1 = (char *)(this->filename_)._M_string_length;
  strlen(local_58);
  std::__cxx11::string::_M_replace((ulong)&this->filename_,0,pcVar1,(ulong)local_58);
  fflush((FILE *)0x0);
  dup2(iVar2,this->fd_);
  close(iVar2);
  return;
}

Assistant:

explicit CapturedStream(int fd) : fd_(fd), uncaptured_fd_(dup(fd)) {
# if GTEST_OS_WINDOWS
    char temp_dir_path[MAX_PATH + 1] = { '\0' };  // NOLINT
    char temp_file_path[MAX_PATH + 1] = { '\0' };  // NOLINT

    ::GetTempPathA(sizeof(temp_dir_path), temp_dir_path);
    const UINT success = ::GetTempFileNameA(temp_dir_path,
                                            "gtest_redir",
                                            0,  // Generate unique file name.
                                            temp_file_path);
    GTEST_CHECK_(success != 0)
        << "Unable to create a temporary file in " << temp_dir_path;
    const int captured_fd = creat(temp_file_path, _S_IREAD | _S_IWRITE);
    GTEST_CHECK_(captured_fd != -1) << "Unable to open temporary file "
                                    << temp_file_path;
    filename_ = temp_file_path;
# else
    // There's no guarantee that a test has write access to the current
    // directory, so we create the temporary file in the /tmp directory
    // instead. We use /tmp on most systems, and /sdcard on Android.
    // That's because Android doesn't have /tmp.
#  if GTEST_OS_LINUX_ANDROID
    // Note: Android applications are expected to call the framework's
    // Context.getExternalStorageDirectory() method through JNI to get
    // the location of the world-writable SD Card directory. However,
    // this requires a Context handle, which cannot be retrieved
    // globally from native code. Doing so also precludes running the
    // code as part of a regular standalone executable, which doesn't
    // run in a Dalvik process (e.g. when running it through 'adb shell').
    //
    // The location /data/local/tmp is directly accessible from native code.
    // '/sdcard' and other variants cannot be relied on, as they are not
    // guaranteed to be mounted, or may have a delay in mounting.
    char name_template[] = "/data/local/tmp/gtest_captured_stream.XXXXXX";
#  else
    char name_template[] = "/tmp/captured_stream.XXXXXX";
#  endif  // GTEST_OS_LINUX_ANDROID
    const int captured_fd = mkstemp(name_template);
    if (captured_fd == -1) {
      GTEST_LOG_(WARNING)
          << "Failed to create tmp file " << name_template
          << " for test; does the test have access to the /tmp directory?";
    }
    filename_ = name_template;
# endif  // GTEST_OS_WINDOWS
    fflush(nullptr);
    dup2(captured_fd, fd_);
    close(captured_fd);
  }